

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZoneFormat::formatOffsetWithAsciiDigits
          (int32_t offset,UChar sep,OffsetFields minFields,OffsetFields maxFields,
          UnicodeString *result)

{
  int local_38;
  OffsetFields local_34;
  int32_t idx;
  int32_t lastIdx;
  int fields [3];
  UChar sign;
  UnicodeString *result_local;
  OffsetFields maxFields_local;
  OffsetFields minFields_local;
  UChar sep_local;
  int32_t offset_local;
  
  fields[1]._2_2_ = L'+';
  minFields_local = offset;
  if (offset < 0) {
    fields[1]._2_2_ = L'-';
    minFields_local = -offset;
  }
  unique0x10000139 = result;
  UnicodeString::setTo(result,fields[1]._2_2_);
  idx = (int)minFields_local / 3600000;
  lastIdx = ((int)minFields_local % 3600000) / 60000;
  fields[0] = (((int)minFields_local % 3600000) % 60000) / 1000;
  for (local_34 = maxFields; ((int)minFields < (int)local_34 && ((&idx)[(int)local_34] == 0));
      local_34 = local_34 - FIELDS_HM) {
  }
  for (local_38 = 0; local_38 <= (int)local_34; local_38 = local_38 + 1) {
    if ((sep != L'\0') && (local_38 != 0)) {
      UnicodeString::append(stack0xffffffffffffffe0,sep);
    }
    UnicodeString::append(stack0xffffffffffffffe0,(short)((&idx)[local_38] / 10) + L'0');
    UnicodeString::append(stack0xffffffffffffffe0,(short)((&idx)[local_38] % 10) + L'0');
  }
  return stack0xffffffffffffffe0;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatOffsetWithAsciiDigits(int32_t offset, UChar sep, OffsetFields minFields, OffsetFields maxFields, UnicodeString& result) {
    U_ASSERT(maxFields >= minFields);
    U_ASSERT(offset > -MAX_OFFSET && offset < MAX_OFFSET);

    UChar sign = PLUS;
    if (offset < 0) {
        sign = MINUS;
        offset = -offset;
    }
    result.setTo(sign);

    int fields[3];
    fields[0] = offset / MILLIS_PER_HOUR;
    offset = offset % MILLIS_PER_HOUR;
    fields[1] = offset / MILLIS_PER_MINUTE;
    offset = offset % MILLIS_PER_MINUTE;
    fields[2] = offset / MILLIS_PER_SECOND;

    U_ASSERT(fields[0] >= 0 && fields[0] <= MAX_OFFSET_HOUR);
    U_ASSERT(fields[1] >= 0 && fields[1] <= MAX_OFFSET_MINUTE);
    U_ASSERT(fields[2] >= 0 && fields[2] <= MAX_OFFSET_SECOND);

    int32_t lastIdx = maxFields;
    while (lastIdx > minFields) {
        if (fields[lastIdx] != 0) {
            break;
        }
        lastIdx--;
    }

    for (int32_t idx = 0; idx <= lastIdx; idx++) {
        if (sep && idx != 0) {
            result.append(sep);
        }
        result.append((UChar)(0x0030 + fields[idx]/10));
        result.append((UChar)(0x0030 + fields[idx]%10));
    }

    return result;
}